

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::CharSet<char16_t>::SubtractRange
          (CharSet<char16_t> *this,ArenaAllocator *allocator,Char lowerChar,Char higherChar)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined6 in_register_0000000a;
  undefined6 in_register_00000012;
  CharSetNode *pCVar3;
  uint i;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ushort uVar7;
  uint l;
  ulong uVar8;
  
  uVar6 = CONCAT62(in_register_0000000a,higherChar) & 0xffffffff;
  uVar8 = CONCAT62(in_register_00000012,lowerChar) & 0xffffffff;
  uVar7 = (ushort)uVar8;
  if (uVar7 <= (ushort)uVar6) {
    pCVar3 = (this->rep).full.root;
    l = (uint)CONCAT62(in_register_00000012,lowerChar);
    uVar5 = (uint)CONCAT62(in_register_0000000a,higherChar);
    if ((undefined1 *)((long)&pCVar3[-1]._vptr_CharSetNode + 7U) < (undefined1 *)0x5) {
      uVar4 = 0;
      while( true ) {
        uVar1 = GetCompactLength(this);
        if (uVar1 <= uVar4) break;
        uVar1 = GetCompactCharU(this,uVar4);
        if ((uVar1 < l) || (uVar5 < uVar1)) {
          uVar4 = uVar4 + 1;
        }
        else {
          RemoveCompactChar(this,uVar4);
        }
      }
    }
    else {
      if (higherChar == L'\xffff' && uVar7 == 0) {
        Clear(this,allocator);
        return;
      }
      if (uVar7 < 0x100) {
        uVar4 = 0xff;
        if (uVar5 < 0xff) {
          uVar4 = uVar5;
        }
        CharBitvec::ClearRange(&(this->rep).full.direct,l,uVar4);
        pCVar3 = (this->rep).full.root;
      }
      if (pCVar3 != (CharSetNode *)0x0) {
        iVar2 = (*pCVar3->_vptr_CharSetNode[3])(pCVar3,allocator,2,uVar8,uVar6);
        (this->rep).compact.countPlusOne = CONCAT44(extraout_var,iVar2);
      }
    }
  }
  return;
}

Assistant:

void CharSet<char16>::SubtractRange(ArenaAllocator* allocator, Char lowerChar, Char higherChar)
    {
        uint lowerValue = CTU(lowerChar);
        uint higherValue = CTU(higherChar);

        if (higherValue < lowerValue)
            return;

        if (IsCompact())
        {
            for (uint i = 0; i < this->GetCompactLength(); )
            {
                uint value = this->GetCompactCharU(i);

                if (value >= lowerValue && value <= higherValue)
                {
                    this->RemoveCompactChar(i);
                }
                else
                {
                    i++;
                }
            }
        }
        else if(lowerValue == 0 && higherValue == MaxUChar)
        {
            this->Clear(allocator);
        }
        else
        {
            if (lowerValue < CharSetNode::directSize)
            {
                uint maxDirectValue = min(higherValue, CharSetNode::directSize - 1);
                rep.full.direct.ClearRange(lowerValue, maxDirectValue);
            }

            if (rep.full.root != nullptr)
            {
                rep.full.root = rep.full.root->ClearRange(allocator, CharSetNode::levels - 1, lowerValue, higherValue);
            }
        }
    }